

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed64
          (UnknownFieldLiteParserHelper *this,uint32_t num,uint64_t value)

{
  uint8_t local_28 [8];
  char buffer [8];
  uint64_t value_local;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  
  if (this->unknown_ != (string *)0x0) {
    buffer = (char  [8])value;
    WriteVarint((ulong)(num * 8 + 1),this->unknown_);
    protobuf::io::CodedOutputStream::WriteLittleEndian64ToArray((uint64_t)buffer,local_28);
    std::__cxx11::string::append((char *)this->unknown_,(ulong)local_28);
  }
  return;
}

Assistant:

void AddFixed64(uint32_t num, uint64_t value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 1, unknown_);
    char buffer[8];
    io::CodedOutputStream::WriteLittleEndian64ToArray(
        value, reinterpret_cast<uint8_t*>(buffer));
    unknown_->append(buffer, 8);
  }